

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O1

void base64_stream_encode_avx(base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 (*pauVar7) [16];
  ulong uVar8;
  long lVar9;
  long lVar10;
  undefined1 (*pauVar11) [16];
  long lVar12;
  undefined1 (*pauVar13) [16];
  undefined1 (*pauVar14) [16];
  byte bVar15;
  uint uVar16;
  long lVar17;
  size_t sVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  size_t local_50;
  ulong local_48;
  
  uVar16 = state->bytes;
  sVar18 = (size_t)uVar16;
  local_50 = 0;
  bVar15 = state->carry;
  if (sVar18 == 2) goto LAB_0010629d;
  if (uVar16 == 1) goto LAB_00106262;
  if (uVar16 == 0) {
    do {
      auVar5 = _DAT_0010b300;
      auVar4 = _DAT_0010b290;
      local_50 = sVar18;
      local_48 = srclen;
      if (0xf < srclen) {
        uVar8 = (srclen - 4) / 0xc;
        local_48 = srclen + uVar8 * -0xc;
        local_50 = uVar8 * 0x10 + sVar18;
        auVar23._8_4_ = 0xfc0fc00;
        auVar23._0_8_ = 0xfc0fc000fc0fc00;
        auVar23._12_4_ = 0xfc0fc00;
        auVar24._8_4_ = 0x4000040;
        auVar24._0_8_ = 0x400004004000040;
        auVar24._12_4_ = 0x4000040;
        auVar25._8_4_ = 0x3f03f0;
        auVar25._0_8_ = 0x3f03f0003f03f0;
        auVar25._12_4_ = 0x3f03f0;
        auVar26._8_4_ = 0x33333333;
        auVar26._0_8_ = 0x3333333333333333;
        auVar26._12_4_ = 0x33333333;
        auVar27._8_4_ = 0x19191919;
        auVar27._0_8_ = 0x1919191919191919;
        auVar27._12_4_ = 0x19191919;
        auVar28._8_4_ = 0xfc0fc00;
        auVar28._0_8_ = 0xfc0fc000fc0fc00;
        auVar28._12_4_ = 0xfc0fc00;
        auVar29._8_4_ = 0x4000040;
        auVar29._0_8_ = 0x400004004000040;
        auVar29._12_4_ = 0x4000040;
        auVar30._8_4_ = 0x3f03f0;
        auVar30._0_8_ = 0x3f03f0003f03f0;
        auVar30._12_4_ = 0x3f03f0;
        auVar31._8_4_ = 0x33333333;
        auVar31._0_8_ = 0x3333333333333333;
        auVar31._12_4_ = 0x33333333;
        auVar32._8_4_ = 0x19191919;
        auVar32._0_8_ = 0x1919191919191919;
        auVar32._12_4_ = 0x19191919;
        pauVar7 = (undefined1 (*) [16])out;
        pauVar11 = (undefined1 (*) [16])src;
        do {
          if (uVar8 < 8) {
            if (3 < uVar8) {
              lVar9 = -4;
              lVar22 = 0x40;
              lVar17 = 0x30;
              lVar21 = 0x24;
              lVar20 = 0x20;
              lVar10 = 0x18;
              lVar6 = 0x10;
              lVar12 = 0xc;
              lVar19 = 0x30;
              pauVar13 = pauVar7;
              pauVar14 = pauVar11;
              goto LAB_00106073;
            }
            src = *pauVar11 + 0xc;
            out = (char *)(pauVar7 + 1);
            auVar34 = vpshufb_avx(*pauVar11,auVar4);
            auVar33 = vpand_avx(auVar34,auVar28);
            auVar2 = vpmulhuw_avx(auVar33,auVar29);
            auVar33 = vpand_avx(auVar34,auVar30);
            auVar34 = vpsllw_avx(auVar33,8);
            auVar33 = vpsllw_avx(auVar33,4);
            auVar33 = vpblendw_avx(auVar33,auVar34,0xaa);
            auVar2 = vpor_avx(auVar33,auVar2);
            auVar34 = vpsubusb_avx(auVar2,auVar31);
            auVar33 = vpcmpgtb_avx(auVar2,auVar32);
            auVar33 = vpsubb_avx(auVar34,auVar33);
            auVar33 = vpshufb_avx(auVar5,auVar33);
            auVar33 = vpaddb_avx(auVar33,auVar2);
            *pauVar7 = auVar33;
            if (uVar8 < 2) break;
            lVar9 = -2;
            lVar22 = 0x20;
            lVar19 = 0x18;
          }
          else {
            auVar34 = vpshufb_avx(*pauVar11,auVar4);
            auVar33 = vpand_avx(auVar34,auVar23);
            auVar2 = vpmulhuw_avx(auVar33,auVar24);
            auVar33 = vpand_avx(auVar34,auVar25);
            auVar34 = vpsllw_avx(auVar33,8);
            auVar33 = vpsllw_avx(auVar33,4);
            auVar33 = vpblendw_avx(auVar33,auVar34,0xaa);
            auVar2 = vpor_avx(auVar33,auVar2);
            auVar34 = vpsubusb_avx(auVar2,auVar26);
            auVar33 = vpcmpgtb_avx(auVar2,auVar27);
            auVar33 = vpsubb_avx(auVar34,auVar33);
            auVar33 = vpshufb_avx(auVar5,auVar33);
            auVar33 = vpaddb_avx(auVar33,auVar2);
            *pauVar7 = auVar33;
            auVar34 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar11 + 0xc),auVar4);
            auVar33 = vpand_avx(auVar34,auVar23);
            auVar2 = vpmulhuw_avx(auVar33,auVar24);
            auVar33 = vpand_avx(auVar34,auVar25);
            auVar34 = vpsllw_avx(auVar33,8);
            auVar33 = vpsllw_avx(auVar33,4);
            auVar33 = vpblendw_avx(auVar33,auVar34,0xaa);
            auVar2 = vpor_avx(auVar33,auVar2);
            auVar34 = vpsubusb_avx(auVar2,auVar26);
            auVar33 = vpcmpgtb_avx(auVar2,auVar27);
            auVar33 = vpsubb_avx(auVar34,auVar33);
            auVar33 = vpshufb_avx(auVar5,auVar33);
            auVar33 = vpaddb_avx(auVar33,auVar2);
            pauVar7[1] = auVar33;
            auVar34 = vpshufb_avx(*(undefined1 (*) [16])(pauVar11[1] + 8),auVar4);
            auVar33 = vpand_avx(auVar34,auVar23);
            auVar2 = vpmulhuw_avx(auVar33,auVar24);
            auVar33 = vpand_avx(auVar34,auVar25);
            auVar34 = vpsllw_avx(auVar33,8);
            auVar33 = vpsllw_avx(auVar33,4);
            auVar33 = vpblendw_avx(auVar33,auVar34,0xaa);
            auVar2 = vpor_avx(auVar33,auVar2);
            auVar34 = vpsubusb_avx(auVar2,auVar26);
            auVar33 = vpcmpgtb_avx(auVar2,auVar27);
            auVar33 = vpsubb_avx(auVar34,auVar33);
            auVar33 = vpshufb_avx(auVar5,auVar33);
            auVar33 = vpaddb_avx(auVar33,auVar2);
            pauVar7[2] = auVar33;
            auVar34 = vpshufb_avx(*(undefined1 (*) [16])(pauVar11[2] + 4),auVar4);
            auVar33 = vpand_avx(auVar34,auVar23);
            auVar2 = vpmulhuw_avx(auVar33,auVar24);
            auVar33 = vpand_avx(auVar34,auVar25);
            auVar34 = vpsllw_avx(auVar33,8);
            auVar33 = vpsllw_avx(auVar33,4);
            auVar33 = vpblendw_avx(auVar33,auVar34,0xaa);
            auVar2 = vpor_avx(auVar33,auVar2);
            auVar34 = vpsubusb_avx(auVar2,auVar26);
            auVar33 = vpcmpgtb_avx(auVar2,auVar27);
            auVar33 = vpsubb_avx(auVar34,auVar33);
            auVar33 = vpshufb_avx(auVar5,auVar33);
            auVar33 = vpaddb_avx(auVar33,auVar2);
            pauVar7[3] = auVar33;
            lVar9 = -8;
            lVar22 = 0x80;
            lVar17 = 0x70;
            lVar21 = 0x54;
            lVar20 = 0x60;
            lVar10 = 0x48;
            lVar6 = 0x50;
            lVar12 = 0x3c;
            lVar19 = 0x60;
            pauVar13 = pauVar7 + 4;
            pauVar14 = pauVar11 + 3;
LAB_00106073:
            auVar34 = vpshufb_avx(*pauVar14,auVar4);
            auVar33 = vpand_avx(auVar34,auVar23);
            auVar2 = vpmulhuw_avx(auVar33,auVar24);
            auVar33 = vpand_avx(auVar34,auVar25);
            auVar34 = vpsllw_avx(auVar33,8);
            auVar33 = vpsllw_avx(auVar33,4);
            auVar33 = vpblendw_avx(auVar33,auVar34,0xaa);
            auVar2 = vpor_avx(auVar33,auVar2);
            auVar34 = vpsubusb_avx(auVar2,auVar26);
            auVar33 = vpcmpgtb_avx(auVar2,auVar27);
            auVar33 = vpsubb_avx(auVar34,auVar33);
            auVar33 = vpshufb_avx(auVar5,auVar33);
            auVar33 = vpaddb_avx(auVar33,auVar2);
            *pauVar13 = auVar33;
            auVar34 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar11 + lVar12),auVar4);
            auVar33 = vpand_avx(auVar34,auVar23);
            auVar2 = vpmulhuw_avx(auVar33,auVar24);
            auVar33 = vpand_avx(auVar34,auVar25);
            auVar34 = vpsllw_avx(auVar33,8);
            auVar33 = vpsllw_avx(auVar33,4);
            auVar33 = vpblendw_avx(auVar33,auVar34,0xaa);
            auVar2 = vpor_avx(auVar33,auVar2);
            auVar34 = vpsubusb_avx(auVar2,auVar26);
            auVar33 = vpcmpgtb_avx(auVar2,auVar27);
            auVar33 = vpsubb_avx(auVar34,auVar33);
            auVar33 = vpshufb_avx(auVar5,auVar33);
            auVar33 = vpaddb_avx(auVar33,auVar2);
            *(undefined1 (*) [16])(*pauVar7 + lVar6) = auVar33;
            auVar34 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar11 + lVar10),auVar4);
            auVar33 = vpand_avx(auVar34,auVar23);
            auVar2 = vpmulhuw_avx(auVar33,auVar24);
            auVar33 = vpand_avx(auVar34,auVar25);
            auVar34 = vpsllw_avx(auVar33,8);
            auVar33 = vpsllw_avx(auVar33,4);
            auVar33 = vpblendw_avx(auVar33,auVar34,0xaa);
            auVar2 = vpor_avx(auVar33,auVar2);
            auVar34 = vpsubusb_avx(auVar2,auVar26);
            auVar33 = vpcmpgtb_avx(auVar2,auVar27);
            auVar33 = vpsubb_avx(auVar34,auVar33);
            auVar33 = vpshufb_avx(auVar5,auVar33);
            auVar33 = vpaddb_avx(auVar33,auVar2);
            *(undefined1 (*) [16])(*pauVar7 + lVar20) = auVar33;
            src = *pauVar11 + lVar21;
            out = *pauVar7 + lVar17;
          }
          auVar34 = vpshufb_avx(*(undefined1 (*) [16])src,auVar4);
          auVar33 = vpand_avx(auVar34,auVar28);
          auVar2 = vpmulhuw_avx(auVar33,auVar29);
          auVar33 = vpand_avx(auVar34,auVar30);
          auVar34 = vpsllw_avx(auVar33,8);
          auVar33 = vpsllw_avx(auVar33,4);
          auVar33 = vpblendw_avx(auVar33,auVar34,0xaa);
          auVar2 = vpor_avx(auVar33,auVar2);
          auVar34 = vpsubusb_avx(auVar2,auVar31);
          auVar33 = vpcmpgtb_avx(auVar2,auVar32);
          auVar33 = vpsubb_avx(auVar34,auVar33);
          auVar33 = vpshufb_avx(auVar5,auVar33);
          auVar33 = vpaddb_avx(auVar33,auVar2);
          *(undefined1 (*) [16])out = auVar33;
          src = *pauVar11 + lVar19;
          out = *pauVar7 + lVar22;
          uVar8 = uVar8 + lVar9;
          pauVar7 = (undefined1 (*) [16])out;
          pauVar11 = (undefined1 (*) [16])src;
        } while (uVar8 != 0);
      }
      if (local_48 == 0) {
        uVar16 = 0;
        break;
      }
      srclen = local_48 - 1;
      (*(undefined1 (*) [16])out)[0] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(byte)(*(undefined1 (*) [16])src)[0] >> 2];
      out = *(undefined1 (*) [16])out + 1;
      puVar3 = *(undefined1 (*) [16])src;
      src = *(undefined1 (*) [16])src + 1;
      bVar15 = (*puVar3 & 3) << 4;
      local_50 = local_50 + 1;
LAB_00106262:
      if (srclen == 0) {
        uVar16 = 1;
        break;
      }
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar15 | (byte)*src >> 4)];
      out = (char *)((uint8_t *)out + 1);
      bVar15 = *src;
      src = (char *)((byte *)src + 1);
      bVar15 = (bVar15 & 0xf) << 2;
      local_50 = local_50 + 1;
LAB_0010629d:
      if (srclen == 0) goto LAB_001062df;
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar15 | (byte)*src >> 6)];
      bVar1 = *src;
      src = (char *)((byte *)src + 1);
      ((uint8_t *)out)[1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 & 0x3f];
      out = (char *)((uint8_t *)out + 2);
      sVar18 = local_50 + 2;
    } while( true );
  }
LAB_001062f2:
  state->bytes = uVar16;
  state->carry = bVar15;
  *outlen = local_50;
  return;
LAB_001062df:
  uVar16 = 2;
  goto LAB_001062f2;
}

Assistant:

BASE64_ENC_FUNCTION(avx)
{
#if HAVE_AVX
	#include "../generic/enc_head.c"
	enc_loop_ssse3(&s, &slen, &o, &olen);
	#include "../generic/enc_tail.c"
#else
	BASE64_ENC_STUB
#endif
}